

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Uint64 UVar4;
  long lVar5;
  undefined8 in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Uint64 current_time;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  float local_5c;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ImGuiIO *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = ImGui::GetIO();
  bVar1 = ImFontAtlas::IsBuilt(local_10->Fonts);
  if (!bVar1) {
    __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/examples/imgui_impl_sdl.cpp"
                  ,0x15a,"void ImGui_ImplSDL2_NewFrame(SDL_Window *)");
  }
  SDL_GetWindowSize(local_8,&local_14,&local_18);
  uVar2 = SDL_GetWindowFlags(local_8);
  if ((uVar2 & 0x40) != 0) {
    local_18 = 0;
    local_14 = 0;
  }
  SDL_GL_GetDrawableSize(local_8,&local_1c,&local_20);
  ImVec2::ImVec2(&local_28,(float)local_14,(float)local_18);
  local_10->DisplaySize = local_28;
  if ((0 < local_14) && (0 < local_18)) {
    ImVec2::ImVec2(&local_30,(float)local_1c / (float)local_14,(float)local_20 / (float)local_18);
    local_10->DisplayFramebufferScale = local_30;
  }
  if ((ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency), iVar3 != 0)) {
    ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
    __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
  }
  UVar4 = SDL_GetPerformanceCounter();
  if (g_Time == 0) {
    local_5c = 0.016666668;
  }
  else {
    lVar5 = UVar4 - g_Time;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar7._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar7._12_4_ = 0x45300000;
    local_5c = (float)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
  }
  local_10->DeltaTime = local_5c;
  g_Time = UVar4;
  ImGui_ImplSDL2_UpdateMousePosAndButtons();
  ImGui_ImplSDL2_UpdateMouseCursor();
  ImGui_ImplSDL2_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    if (SDL_GetWindowFlags(window) & SDL_WINDOW_MINIMIZED)
        w = h = 0;
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}